

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeCommandListAppendMemoryRangesBarrier
          (ze_command_list_handle_t hCommandList,uint32_t numRanges,size_t *pRangeSizes,
          void **pRanges,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  long lVar6;
  undefined4 in_register_0000008c;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  uVar7 = CONCAT44(in_register_0000008c,numWaitEvents);
  lVar8 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zeCommandListAppendMemoryRangesBarrier(hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEventsLocal)"
             ,"");
  if (*(char *)(lVar8 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar8 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar4 + 0x250);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar8 = *(long *)(lVar4 + 0xd30);
    lVar2 = *(long *)(lVar4 + 0xd38);
    lVar6 = lVar2 - lVar8 >> 3;
    if (lVar2 != lVar8) {
      lVar9 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar9 * 8);
        result = (**(code **)(*plVar3 + 0x300))
                           (plVar3,hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar7,
                            phWaitEvents);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014f98d;
        lVar9 = lVar9 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
    }
    if (((*(char *)(lVar4 + 4) != '\x01') ||
        (result = ZEHandleLifetimeValidation::zeCommandListAppendMemoryRangesBarrierPrologue
                            (*(ZEHandleLifetimeValidation **)(lVar4 + 0xd48),hCommandList,numRanges,
                             pRangeSizes,pRanges,hSignalEvent,numWaitEvents,phWaitEvents),
        result == ZE_RESULT_SUCCESS)) &&
       (zVar5 = (*pcVar1)(hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar7,phWaitEvents
                         ), result = zVar5, lVar2 != lVar8)) {
      lVar8 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(lVar4 + 0xd30) + lVar8 * 8);
        result = (**(code **)(*plVar3 + 0x308))
                           (plVar3,hCommandList,numRanges,pRangeSizes,pRanges,hSignalEvent,uVar7,
                            phWaitEvents,zVar5);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar8 = lVar8 + 1;
        result = zVar5;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
    }
  }
LAB_0014f98d:
  logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryRangesBarrier(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numRanges,                             ///< [in] number of memory ranges
        const size_t* pRangeSizes,                      ///< [in][range(0, numRanges)] array of sizes of memory range
        const void** pRanges,                           ///< [in][range(0, numRanges)] array of memory ranges
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing barrier;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing barrier
        )
    {
        context.logger->log_trace("zeCommandListAppendMemoryRangesBarrier(hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEventsLocal)");

        auto pfnAppendMemoryRangesBarrier = context.zeDdiTable.CommandList.pfnAppendMemoryRangesBarrier;

        if( nullptr == pfnAppendMemoryRangesBarrier )
            return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryRangesBarrierPrologue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListAppendMemoryRangesBarrierPrologue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }

        auto driver_result = pfnAppendMemoryRangesBarrier( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListAppendMemoryRangesBarrierEpilogue( hCommandList, numRanges, pRangeSizes, pRanges, hSignalEvent, numWaitEvents, phWaitEvents ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", result);
        }

        return logAndPropagateResult("zeCommandListAppendMemoryRangesBarrier", driver_result);
    }